

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::ArrayLengthFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  long lVar2;
  pointer function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffb84;
  undefined4 in_stack_fffffffffffffb8c;
  FunctionNullHandling in_stack_fffffffffffffb98;
  allocator_type local_461;
  bind_lambda_function_t in_stack_fffffffffffffba0;
  _Any_data local_448;
  code *local_438;
  undefined8 uStack_430;
  _Any_data local_428;
  code *local_418;
  undefined8 uStack_410;
  LogicalType local_408 [3];
  vector<duckdb::LogicalType,_true> local_3c0;
  LogicalType local_3a8;
  vector<duckdb::LogicalType,_true> local_390;
  LogicalType local_378;
  LogicalType local_360;
  string local_348;
  ScalarFunction local_328;
  ScalarFunction local_200;
  BaseScalarFunction local_d8;
  
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"array_length","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffba0,ANY);
  LogicalType::LIST(local_408,(LogicalType *)&stack0xfffffffffffffba0);
  __l._M_len = 1;
  __l._M_array = local_408;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_390,__l,
             &local_461);
  LogicalType::LogicalType(&local_3a8,BIGINT);
  local_418 = (code *)0x0;
  uStack_410 = 0;
  local_428._M_unused._M_object = (void *)0x0;
  local_428._8_8_ = 0;
  LogicalType::LogicalType(&local_360,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_360;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffb84;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffb8c;
  ScalarFunction::ScalarFunction
            (&local_200,&local_390,&local_3a8,(scalar_function_t *)&local_428,ArrayOrListLengthBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffb98,in_stack_fffffffffffffba0);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_200);
  local_200.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  if (local_200.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_200.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_200.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_200.function.super__Function_base._M_manager)
              ((_Any_data *)&local_200.function,(_Any_data *)&local_200.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_200.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_360);
  if (local_418 != (code *)0x0) {
    (*local_418)(&local_428,&local_428,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_3a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_390);
  LogicalType::~LogicalType(local_408);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffba0);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffba0,ANY);
  LogicalType::LIST(local_408,(LogicalType *)&stack0xfffffffffffffba0);
  LogicalType::LogicalType(local_408 + 1,BIGINT);
  __l_00._M_len = 2;
  __l_00._M_array = local_408;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3c0,__l_00,
             &local_461);
  LogicalType::LogicalType(local_408 + 2,BIGINT);
  local_438 = (code *)0x0;
  uStack_430 = 0;
  local_448._M_unused._M_object = (void *)0x0;
  local_448._8_8_ = 0;
  LogicalType::LogicalType(&local_378,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_378;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffb84;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffb8c;
  ScalarFunction::ScalarFunction
            (&local_328,&local_3c0,local_408 + 2,(scalar_function_t *)&local_448,
             ArrayOrListLengthBinaryBind,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffffb98,in_stack_fffffffffffffba0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_328);
  local_328.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  if (local_328.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_328.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_328.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_328.function.super__Function_base._M_manager)
              ((_Any_data *)&local_328.function,(_Any_data *)&local_328.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_328.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_378);
  if (local_438 != (code *)0x0) {
    (*local_438)(&local_448,&local_448,__destroy_functor);
  }
  LogicalType::~LogicalType(local_408 + 2);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3c0);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_408[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffba0);
  function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
             super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function != pSVar1) {
    do {
      BaseScalarFunction::SetReturnsError(&local_d8,&function->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_d8);
      function = function + 1;
    } while (function != pSVar1);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet ArrayLengthFun::GetFunctions() {
	ScalarFunctionSet array_length("array_length");
	array_length.AddFunction(
	    ScalarFunction({LogicalType::LIST(LogicalType::ANY)}, LogicalType::BIGINT, nullptr, ArrayOrListLengthBind));
	array_length.AddFunction(ScalarFunction({LogicalType::LIST(LogicalType::ANY), LogicalType::BIGINT},
	                                        LogicalType::BIGINT, nullptr, ArrayOrListLengthBinaryBind));
	for (auto &func : array_length.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return (array_length);
}